

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::schema::Value::Builder::initList(Builder *__return_storage_ptr__,Builder *this)

{
  PointerBuilder builder;
  uint uVar1;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::schema::Value::Which>(&this->_builder,uVar1,LIST);
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  builder.capTable = local_28.capTable;
  builder.segment = local_28.segment;
  builder.pointer = local_28.pointer;
  AnyPointer::Builder::Builder(__return_storage_ptr__,builder);
  AnyPointer::Builder::clear(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline ::capnp::AnyPointer::Builder Value::Builder::initList() {
  _builder.setDataField<Value::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Value::LIST);
  auto result = ::capnp::AnyPointer::Builder(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS));
  result.clear();
  return result;
}